

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineDynamicStateCreateInfo *dynamic,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  ushort uVar1;
  ulong uVar2;
  Value dynamics;
  Data local_78;
  Data *local_60;
  Data local_58;
  Data local_48;
  
  local_58.n.i64 = (Number)0x0;
  local_58.s.str = (Ch *)0x3000000000000;
  local_78._4_1_ = '\0';
  local_78._5_1_ = '\0';
  local_78._6_1_ = '\0';
  local_78._7_1_ = '\0';
  local_78._0_4_ = dynamic->flags;
  local_48.s.str = (Ch *)0x40500000014fbef;
  local_48.n = (Number)0x5;
  local_78.s.str = (Ch *)((ulong)(-1 < (int)dynamic->flags) << 0x35 | 0x1d6000000000000);
  local_60 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,alloc);
  local_48.n = (Number)0x0;
  local_48.s.str = (Ch *)0x4000000000000;
  if (dynamic->dynamicStateCount != 0) {
    uVar2 = 0;
    do {
      local_78.n = (Number)(long)(int)dynamic->pDynamicStates[uVar2];
      uVar1 = 0x1f6;
      if ((long)local_78.n < 0) {
        uVar1 = 0xb6;
      }
      local_78.s.str = (Ch *)((ulong)uVar1 << 0x30);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_48.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_78.s,alloc);
      uVar2 = uVar2 + 1;
    } while (uVar2 < dynamic->dynamicStateCount);
  }
  local_78.s.str = (Ch *)0x4050000001501da;
  local_78.n = (Number)0xc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,alloc);
  if (&local_58 != local_60) {
    local_60->n = (int64_t)local_58.n;
    (&local_60->n)[1].i64 = (int64_t)local_58.s.str;
  }
  return SUB81(local_60,0);
}

Assistant:

static bool json_value(const VkPipelineDynamicStateCreateInfo &dynamic, Allocator &alloc, Value *out_value)
{
	Value dyn(kObjectType);
	dyn.AddMember("flags", dynamic.flags, alloc);
	Value dynamics(kArrayType);
	for (uint32_t i = 0; i < dynamic.dynamicStateCount; i++)
		dynamics.PushBack(dynamic.pDynamicStates[i], alloc);
	dyn.AddMember("dynamicState", dynamics, alloc);

	*out_value = dyn;
	return true;
}